

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxVectorBuiltin::Emit(FxVectorBuiltin *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  bool bVar2;
  int iVar3;
  int count;
  undefined4 extraout_var;
  ExpEmit local_30;
  ExpEmit len;
  ExpEmit op;
  VMFunctionBuilder *build_local;
  FxVectorBuiltin *this_local;
  ExpEmit to;
  
  iVar3 = PType::GetRegType((this->super_FxExpression).ValueType);
  count = PType::GetRegCount((this->super_FxExpression).ValueType);
  ExpEmit::ExpEmit((ExpEmit *)&this_local,build,iVar3,count);
  len._0_4_ = (*this->Self->_vptr_FxExpression[9])(this->Self,build);
  len.Konst = (bool)(char)extraout_var;
  len.Fixed = (bool)(char)((uint)extraout_var >> 8);
  len.Final = (bool)(char)((uint)extraout_var >> 0x10);
  len.Target = (bool)(char)((uint)extraout_var >> 0x18);
  bVar2 = FName::operator==(&this->Function,NAME_Length);
  if (bVar2) {
    iVar3 = 0xc9;
    if ((PStruct *)this->Self->ValueType == TypeVector2) {
      iVar3 = 0xbd;
    }
    VMFunctionBuilder::Emit(build,iVar3,(uint)(ushort)this_local,len.RegNum);
  }
  else {
    ExpEmit::ExpEmit(&local_30,build,1,1);
    iVar3 = 0xc9;
    if ((PStruct *)this->Self->ValueType == TypeVector2) {
      iVar3 = 0xbd;
    }
    VMFunctionBuilder::Emit(build,iVar3,(uint)local_30.RegNum,len.RegNum);
    iVar3 = 199;
    if ((PStruct *)this->Self->ValueType == TypeVector2) {
      iVar3 = 0xbb;
    }
    VMFunctionBuilder::Emit
              (build,iVar3,(uint)(ushort)this_local,(uint)len.RegNum,(uint)local_30.RegNum);
    ExpEmit::Free(&local_30,build);
  }
  ExpEmit::Free(&len,build);
  EVar1.RegType = this_local._2_1_;
  EVar1.RegCount = this_local._3_1_;
  EVar1.Konst = (bool)this_local._4_1_;
  EVar1.Fixed = (bool)this_local._5_1_;
  EVar1.Final = (bool)this_local._6_1_;
  EVar1.Target = (bool)this_local._7_1_;
  EVar1.RegNum = (ushort)this_local;
  return EVar1;
}

Assistant:

ExpEmit FxVectorBuiltin::Emit(VMFunctionBuilder *build)
{
	ExpEmit to(build, ValueType->GetRegType(), ValueType->GetRegCount());
	ExpEmit op = Self->Emit(build);
	if (Function == NAME_Length)
	{
		build->Emit(Self->ValueType == TypeVector2 ? OP_LENV2 : OP_LENV3, to.RegNum, op.RegNum);
	}
	else
	{
		ExpEmit len(build, REGT_FLOAT);
		build->Emit(Self->ValueType == TypeVector2 ? OP_LENV2 : OP_LENV3, len.RegNum, op.RegNum);
		build->Emit(Self->ValueType == TypeVector2 ? OP_DIVVF2_RR : OP_DIVVF3_RR, to.RegNum, op.RegNum, len.RegNum);
		len.Free(build);
	}
	op.Free(build);
	return to;
}